

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O3

void __thiscall
Js::FunctionCodeGenJitTimeData::FunctionCodeGenJitTimeData
          (FunctionCodeGenJitTimeData *this,FunctionInfo *functionInfo,EntryPointInfo *entryPoint,
          Var globalThis,uint16 profiledIterations,bool isInlined)

{
  Memory::Recycler::WBSetBit((char *)this);
  (this->functionInfo).ptr = functionInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  Memory::Recycler::WBSetBit((char *)&this->entryPointInfo);
  (this->entryPointInfo).ptr = entryPoint;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entryPointInfo);
  ObjTypeSpecFldInfoArray::ObjTypeSpecFldInfoArray(&this->objTypeSpecFldInfoArray);
  this->globalObjTypeSpecFldInfoCount = 0;
  (this->globalObjTypeSpecFldInfoArray).ptr = (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0;
  (this->inlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0;
  (this->ldFldInlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0;
  (this->callbackInlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0;
  (this->callApplyTargetInlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0;
  (this->weakFuncRef).ptr = (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  (this->inlineeInfo).ptr = (PolymorphicInlineCacheInfoIDL *)0x0;
  (this->selfInfo).ptr = (PolymorphicInlineCacheInfoIDL *)0x0;
  (this->polymorphicInlineCaches).ptr = (PolymorphicInlineCacheIDL *)0x0;
  Memory::Recycler::WBSetBit((char *)&this->globalThisObject);
  (this->globalThisObject).ptr = globalThis;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->globalThisObject);
  this->inlineeCount = 0;
  this->ldFldInlineeCount = 0;
  (this->next).ptr = (FunctionCodeGenJitTimeData *)0x0;
  this->isInlined = isInlined;
  this->isAggressiveInliningEnabled = false;
  this->profiledIterations = profiledIterations;
  (this->inlineCacheStats).ptr = (FieldAccessStats *)0x0;
  (this->inlineesBv).ptr = (BVFixed *)0x0;
  *(undefined8 *)((long)&(this->inlineesBv).ptr + 4) = 0;
  *(undefined8 *)((long)&(this->sharedPropertyGuards).ptr + 4) = 0;
  return;
}

Assistant:

FunctionCodeGenJitTimeData::FunctionCodeGenJitTimeData(FunctionInfo *const functionInfo, EntryPointInfo *const entryPoint, Var globalThis, uint16 profiledIterations, bool isInlined) :
        functionInfo(functionInfo), entryPointInfo(entryPoint), globalObjTypeSpecFldInfoCount(0), globalObjTypeSpecFldInfoArray(nullptr),
        weakFuncRef(nullptr), inlinees(nullptr), inlineeCount(0), ldFldInlineeCount(0), isInlined(isInlined), isAggressiveInliningEnabled(false),
#ifdef FIELD_ACCESS_STATS
        inlineCacheStats(nullptr),
#endif
        next(nullptr),
        ldFldInlinees(nullptr),
        callbackInlinees(nullptr),
        callApplyTargetInlinees(nullptr),
        globalThisObject(globalThis),
        profiledIterations(profiledIterations),
        sharedPropertyGuards(nullptr),
        sharedPropertyGuardCount(0)
    {
    }